

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.h
# Opt level: O2

void __thiscall
icu_63::StringTrieBuilder::IntermediateValueNode::IntermediateValueNode
          (IntermediateValueNode *this,int32_t v,Node *nextNode)

{
  int iVar1;
  
  if (nextNode == (Node *)0x0) {
    iVar1 = -0x4977782e;
  }
  else {
    iVar1 = nextNode->hash * 0x25 + -0x4977782e;
  }
  (this->super_ValueNode).super_Node.offset = 0;
  (this->super_ValueNode).super_Node.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UObject_003ab878;
  this->next = nextNode;
  (this->super_ValueNode).hasValue = '\x01';
  (this->super_ValueNode).value = v;
  (this->super_ValueNode).super_Node.hash = iVar1 + v;
  return;
}

Assistant:

static inline int32_t hashCode(const Node *node) { return node==NULL ? 0 : node->hashCode(); }